

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

bool getFunctionNameAndStartLineForAddress
               (DWARFCompileUnit *CU,uint64_t Address,FunctionNameKind Kind,string *FunctionName,
               uint32_t *StartLine)

{
  undefined1 extraout_AL;
  reference this;
  char *pcVar1;
  uint64_t uVar2;
  undefined1 local_78 [8];
  SmallVector<llvm::DWARFDie,_4U> InlinedChain;
  
  local_78 = (undefined1  [8])
             &InlinedChain.super_SmallVectorImpl<llvm::DWARFDie>.
              super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
              super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size;
  InlinedChain.super_SmallVectorImpl<llvm::DWARFDie>.
  super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
  super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.BeginX =
       (void *)0x400000000;
  llvm::DWARFUnit::getInlinedChainForAddress
            (&CU->super_DWARFUnit,Address,(SmallVectorImpl<llvm::DWARFDie> *)local_78);
  if ((int)InlinedChain.super_SmallVectorImpl<llvm::DWARFDie>.
           super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
           super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.BeginX != 0)
  {
    this = llvm::SmallVectorTemplateCommon<llvm::DWARFDie,_void>::operator[]
                     ((SmallVectorTemplateCommon<llvm::DWARFDie,_void> *)local_78,0);
    if (Kind != None) {
      pcVar1 = llvm::DWARFDie::getSubroutineName(this,Kind);
      if (pcVar1 != (char *)0x0) {
        std::__cxx11::string::assign((char *)FunctionName);
      }
    }
    uVar2 = llvm::DWARFDie::getDeclLine(this);
    if (uVar2 != 0) {
      *StartLine = (uint32_t)uVar2;
    }
  }
  llvm::SmallVectorImpl<llvm::DWARFDie>::~SmallVectorImpl
            ((SmallVectorImpl<llvm::DWARFDie> *)local_78);
  return (bool)extraout_AL;
}

Assistant:

static bool getFunctionNameAndStartLineForAddress(DWARFCompileUnit *CU,
                                                  uint64_t Address,
                                                  FunctionNameKind Kind,
                                                  std::string &FunctionName,
                                                  uint32_t &StartLine) {
  // The address may correspond to instruction in some inlined function,
  // so we have to build the chain of inlined functions and take the
  // name of the topmost function in it.
  SmallVector<DWARFDie, 4> InlinedChain;
  CU->getInlinedChainForAddress(Address, InlinedChain);
  if (InlinedChain.empty())
    return false;

  const DWARFDie &DIE = InlinedChain[0];
  bool FoundResult = false;
  const char *Name = nullptr;
  if (Kind != FunctionNameKind::None && (Name = DIE.getSubroutineName(Kind))) {
    FunctionName = Name;
    FoundResult = true;
  }
  if (auto DeclLineResult = DIE.getDeclLine()) {
    StartLine = DeclLineResult;
    FoundResult = true;
  }

  return FoundResult;
}